

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EnumType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::ASTContext_const&>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1,Type *args_2,
          ASTContext *args_3)

{
  EnumType *pEVar1;
  size_t in_RCX;
  BumpAllocator *in_RDX;
  size_t in_R8;
  ASTContext *unaff_retaddr;
  Type *in_stack_00000008;
  
  pEVar1 = (EnumType *)allocate(in_RDX,in_RCX,in_R8);
  ast::EnumType::EnumType
            ((EnumType *)args_2,(Compilation *)args_3,(SourceLocation)args_1,in_stack_00000008,
             unaff_retaddr);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }